

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O0

int pybind11_object_init(PyObject *self,PyObject *param_2,PyObject *param_3)

{
  undefined8 uVar1;
  undefined8 uVar2;
  string local_68;
  undefined1 local_48 [8];
  string msg;
  PyTypeObject *type;
  PyObject *param_2_local;
  PyObject *param_1_local;
  PyObject *self_local;
  
  msg.field_2._8_8_ = self->ob_type;
  pybind11::detail::get_fully_qualified_tp_name_abi_cxx11_
            (&local_68,(detail *)msg.field_2._8_8_,(PyTypeObject *)param_3);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 &local_68,": No constructor defined!");
  std::__cxx11::string::~string((string *)&local_68);
  uVar1 = _PyExc_TypeError;
  uVar2 = std::__cxx11::string::c_str();
  PyErr_SetString(uVar1,uVar2);
  std::__cxx11::string::~string((string *)local_48);
  return -1;
}

Assistant:

inline int pybind11_object_init(PyObject *self, PyObject *, PyObject *) {
    PyTypeObject *type = Py_TYPE(self);
    std::string msg = get_fully_qualified_tp_name(type) + ": No constructor defined!";
    PyErr_SetString(PyExc_TypeError, msg.c_str());
    return -1;
}